

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::Buffers::ErrorsTest::TestErrorsOfClearNamedBufferSubData
          (ErrorsTest *this)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  uint *puVar9;
  byte bVar10;
  GLuint not_a_buffer_name;
  GLuint GVar11;
  GLenum GVar12;
  GLenum *pGVar13;
  ulong uVar14;
  GLuint buffer;
  GLenum invalid_format;
  GLubyte dummy_data [4];
  GLuint local_44;
  byte local_3f;
  byte local_3e;
  byte local_3d;
  byte local_3c;
  byte local_3b;
  byte local_3a;
  byte local_39;
  GLenum local_38 [2];
  long lVar8;
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar6);
  local_44 = 0;
  local_38[1] = 0;
  (**(code **)(lVar8 + 0x3b8))(1);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glCreateBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xb42);
  (*this->m_pNamedBufferStorage)(local_44,4,local_38 + 1,0x43);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glNamedBuffeStorage failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xb46);
  GVar11 = 0;
  do {
    GVar11 = GVar11 + 1;
    cVar1 = (**(code **)(lVar8 + 0xc68))(GVar11);
  } while (cVar1 != '\0');
  (*this->m_pClearNamedBufferSubData)(GVar11,0x8229,0,4,0x1908,0x1401,local_38 + 1);
  bVar2 = ErrorCheckAndLog(this,"glClearNamedBufferSubData",0x502,
                           " if buffer is not the name of an existing buffer object.");
  GVar12 = 0;
  do {
    GVar12 = GVar12 + 1;
    uVar14 = 9;
    pGVar13 = TestErrorsOfClearNamedBufferSubData::valid_internal_formats + 2;
    do {
      if (pGVar13[-2] == GVar12) {
        pGVar13 = pGVar13 + -2;
        goto LAB_00a97f76;
      }
      if (pGVar13[-1] == GVar12) {
        pGVar13 = pGVar13 + -1;
        goto LAB_00a97f76;
      }
      if (*pGVar13 == GVar12) goto LAB_00a97f76;
      if (pGVar13[1] == GVar12) {
        pGVar13 = pGVar13 + 1;
        goto LAB_00a97f76;
      }
      uVar14 = uVar14 - 1;
      pGVar13 = pGVar13 + 4;
    } while (1 < uVar14);
    pGVar13 = TestErrorsOfClearNamedBufferSubData::valid_internal_formats +
              (ulong)(GVar12 != 0x8d70) + 0x20;
LAB_00a97f76:
    if (pGVar13 == TestErrorsOfClearNamedBufferSubData::valid_internal_formats + 0x21) {
      pGVar13 = local_38 + 1;
      (*this->m_pClearNamedBufferData)(local_44,GVar12,0x1908,0x1401,pGVar13);
      local_39 = ErrorCheckAndLog(this,"glClearNamedBufferSubData",0x500,
                                  " if internal format is not one of the valid sized internal formats (GL_R8, GL_R16, GL_R16F, GL_R32F, GL_R8I, GL_R16I, GL_R32I, GL_R8UI, GL_R16UI, GL_R32UI, GL_RG8, GL_RG16, GL_RG16F, GL_RG32F, GL_RG8I, GL_RG16I, GL_RG32I, GL_RG8UI, GL_RG16UI, GL_RG32UI, GL_RGB32F, GL_RGB32I, GL_RGB32UI, GL_RGBA8, GL_RGBA16, GL_RGBA16F, GL_RGBA32F, GL_RGBA8I, GL_RGBA16I, GL_RGBA32I, GL_RGBA8UI, GL_RGBA16UI, GL_RGBA32UI)."
                                 );
      (*this->m_pClearNamedBufferSubData)(local_44,0x8058,1,4,0x1908,0x1401,pGVar13);
      local_3a = ErrorCheckAndLog(this,"glClearNamedBufferSubData",0x501,
                                  "if offset is not multiples of the number of basic machine units (GLubyte)per-element for the internal format (GL_RGBA) specified by internal format."
                                 );
      (*this->m_pClearNamedBufferSubData)(local_44,0x8058,0,3,0x1908,0x1401,pGVar13);
      local_3b = ErrorCheckAndLog(this,"glClearNamedBufferSubData",0x501,
                                  "if range is not multiples of the number of basic machine units (GLubyte)per-element for the internal format (GL_RGBA) specified by internal format."
                                 );
      (*this->m_pClearNamedBufferSubData)(local_44,0x8229,-1,4,0x1908,0x1401,pGVar13);
      local_3c = ErrorCheckAndLog(this,"glClearNamedBufferSubData",0x501,
                                  " if offset or size is negative.");
      (*this->m_pClearNamedBufferSubData)(local_44,0x8229,0,-4,0x1908,0x1401,pGVar13);
      local_3d = ErrorCheckAndLog(this,"glClearNamedBufferSubData",0x501,
                                  " if offset or size is negative.");
      (*this->m_pClearNamedBufferSubData)(local_44,0x8229,0,8,0x1908,0x1401,pGVar13);
      local_3e = ErrorCheckAndLog(this,"glClearNamedBufferSubData",0x501,
                                  " if offset+size is greater than the value of BUFFER_SIZE for the specified buffer object."
                                 );
      (*this->m_pMapNamedBuffer)(local_44,35000);
      dVar7 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar7,"glMapNamedBuffer failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0xbac);
      (*this->m_pClearNamedBufferSubData)(local_44,0x8229,0,4,0x1908,0x1401,pGVar13);
      local_3f = ErrorCheckAndLog(this,"glClearNamedBufferSubData",0x502,
                                  " if any part of the specified range of the buffer object is mapped with MapBuffer, unless it was mapped with the MAP_PERSISTENT_BIT bit set in the MapBufferRange access flags."
                                 );
      (*this->m_pUnmapNamedBuffer)(local_44);
      dVar7 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar7,"glUnmapNamedBuffer failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0xbb6);
      (*this->m_pMapNamedBufferRange)(local_44,0,4,1);
      dVar7 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar7,"glMapNamedBuffer failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0xbbc);
      (*this->m_pClearNamedBufferSubData)(local_44,0x8229,0,4,0x1908,0x1401,pGVar13);
      bVar3 = ErrorCheckAndLog(this,"glClearNamedBufferSubData",0x502,
                               " if any part of the specified range of the buffer object is mapped with MapBufferRange, unless it was mapped with the MAP_PERSISTENT_BIT bit set in the MapBufferRange access flags."
                              );
      (*this->m_pUnmapNamedBuffer)(local_44);
      dVar7 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar7,"glUnmapNamedBuffer failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0xbc6);
      (*this->m_pMapNamedBufferRange)(local_44,0,4,0x41);
      dVar7 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar7,"glMapNamedBuffer failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0xbcd);
      (*this->m_pClearNamedBufferSubData)(local_44,0x8229,0,4,0x1908,0x1401,pGVar13);
      bVar4 = ErrorCheckAndLog(this,"glClearNamedBufferSubData",0,
                               " if any part of the specified range of the buffer object is mapped with MapBuffer with the MAP_PERSISTENT_BIT bit set in the MapBufferRange access flags."
                              );
      (*this->m_pUnmapNamedBuffer)(local_44);
      dVar7 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar7,"glUnmapNamedBuffer failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0xbd7);
      bVar10 = bVar2 & local_39 & local_3a & local_3b & local_3c & local_3d & local_3e & local_3f;
      local_38[0] = 0;
      do {
        local_38[0] = local_38[0] + 1;
        puVar9 = std::
                 __find_if<unsigned_int_const*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                           (TestErrorsOfClearNamedBufferSubData::valid_formats,0x1b06098,local_38);
      } while (puVar9 != TestErrorsOfClearNamedBufferSubData::valid_formats + 0xe);
      (*this->m_pClearNamedBufferSubData)(local_44,0x8229,0,4,local_38[0],0x1401,local_38 + 1);
      bVar2 = ErrorCheckAndLog(this,"glClearNamedBufferSubData",0x500,
                               " if format is not a valid format (one of GL_RED, GL_RG, GL_RGB, GL_BGR, GL_RGBA, GL_BGRA, GL_RED_INTEGER, GL_RG_INTEGER, GL_RGB_INTEGER, GL_BGR_INTEGER, GL_RGBA_INTEGER, GL_BGRA_INTEGER, GL_STENCIL_INDEX, GL_DEPTH_COMPONENT, GL_DEPTH_STENCIL)."
                              );
      local_38[0] = 0;
      do {
        local_38[0] = local_38[0] + 1;
        puVar9 = std::
                 __find_if<unsigned_int_const*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                           (TestErrorsOfClearNamedBufferSubData::valid_types,0x1b060dc,local_38);
      } while (puVar9 != TestErrorsOfClearNamedBufferSubData::valid_types + 0xf);
      (*this->m_pClearNamedBufferSubData)(local_44,0x8229,0,4,0x1908,local_38[0],local_38 + 1);
      bVar5 = ErrorCheckAndLog(this,"glClearNamedBufferSubData",0x500,
                               " if format is not a valid type (one of GL_UNSIGNED_BYTE, GL_BYTE, GL_UNSIGNED_SHORT, GL_SHORT, GL_UNSIGNED_INT, GL_INT, GL_FLOAT, GL_UNSIGNED_BYTE_3_3_2, GL_UNSIGNED_BYTE_2_3_3_REV, GL_UNSIGNED_SHORT_5_6_5, GL_UNSIGNED_SHORT_5_6_5_REV, GL_UNSIGNED_SHORT_4_4_4_4, GL_UNSIGNED_SHORT_4_4_4_4_REV, GL_UNSIGNED_SHORT_5_5_5_1, GL_UNSIGNED_SHORT_1_5_5_5_REV, GL_UNSIGNED_INT_8_8_8_8, GL_UNSIGNED_INT_8_8_8_8_REV, GL_UNSIGNED_INT_10_10_10_2, and GL_UNSIGNED_INT_2_10_10_10_REV)."
                              );
      if (local_44 != 0) {
        (**(code **)(lVar8 + 0x438))(1,&local_44);
      }
      return (bool)(bVar10 & bVar3 & bVar4 & bVar2 & bVar5);
    }
  } while( true );
}

Assistant:

bool ErrorsTest::TestErrorsOfClearNamedBufferSubData()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Return value. */
	bool is_ok			= true;
	bool internal_error = false;

	/* Common variables. */
	glw::GLuint  buffer		   = 0;
	glw::GLubyte dummy_data[4] = {};

	try
	{
		/* Common preparations. */
		gl.createBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

		m_pNamedBufferStorage(buffer, sizeof(dummy_data), &dummy_data,
							  GL_MAP_READ_BIT | GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBuffeStorage failed.");

		/* Test invalid buffer name error behavior. */
		{
			/* Prepare for invalid buffer name error behavior verification. */
			glw::GLuint not_a_buffer_name = 0;

			while (gl.isBuffer(++not_a_buffer_name))
				;

			/* Test. */
			m_pClearNamedBufferSubData(not_a_buffer_name, GL_R8, 0, sizeof(dummy_data), GL_RGBA, GL_UNSIGNED_BYTE,
									   &dummy_data);

			is_ok &= ErrorCheckAndLog("glClearNamedBufferSubData", GL_INVALID_OPERATION,
									  " if buffer is not the name of an existing buffer object.");
		}

		/* Test invalid sized internal format error behavior. */
		{
			/* Prepare for invalid sized internal format error behavior verification. */
			static const glw::GLenum valid_internal_formats[] = {
				GL_R8,		GL_R16,		GL_R16F,	GL_R32F,	 GL_R8I,	  GL_R16I,	GL_R32I,
				GL_R8UI,	GL_R16UI,   GL_R32UI,   GL_RG8,		 GL_RG16,	 GL_RG16F,   GL_RG32F,
				GL_RG8I,	GL_RG16I,   GL_RG32I,   GL_RG8UI,	GL_RG16UI,   GL_RG32UI,  GL_RGB32F,
				GL_RGB32I,  GL_RGB32UI, GL_RGBA8,   GL_RGBA16,   GL_RGBA16F,  GL_RGBA32F, GL_RGBA8I,
				GL_RGBA16I, GL_RGBA32I, GL_RGBA8UI, GL_RGBA16UI, GL_RGBA32UI, GL_NONE
			};
			static const glw::GLenum valid_internal_formats_last =
				sizeof(valid_internal_formats) / sizeof(valid_internal_formats[0]) - 1;

			glw::GLenum invalid_internal_format = 0;

			while (&valid_internal_formats[valid_internal_formats_last] !=
				   std::find(&valid_internal_formats[0], &valid_internal_formats[valid_internal_formats_last],
							 (++invalid_internal_format)))
				;

			/* Test. */
			m_pClearNamedBufferData(buffer, invalid_internal_format, GL_RGBA, GL_UNSIGNED_BYTE, &dummy_data);

			is_ok &= ErrorCheckAndLog("glClearNamedBufferSubData", GL_INVALID_ENUM,
									  " if internal format is not one of the valid sized internal formats "
									  "(GL_R8, GL_R16, GL_R16F, GL_R32F, GL_R8I, GL_R16I, GL_R32I, GL_R8UI,"
									  " GL_R16UI, GL_R32UI, GL_RG8, GL_RG16, GL_RG16F, GL_RG32F, GL_RG8I, GL_RG16I,"
									  " GL_RG32I, GL_RG8UI, GL_RG16UI, GL_RG32UI, GL_RGB32F, GL_RGB32I, GL_RGB32UI,"
									  " GL_RGBA8, GL_RGBA16, GL_RGBA16F, GL_RGBA32F, GL_RGBA8I, GL_RGBA16I, GL_RGBA32I,"
									  " GL_RGBA8UI, GL_RGBA16UI, GL_RGBA32UI).");
		}

		/* Test incorrect offset alignment error behavior. */
		{
			/* Test. */
			m_pClearNamedBufferSubData(buffer, GL_RGBA8, sizeof(dummy_data[0]), sizeof(dummy_data), GL_RGBA,
									   GL_UNSIGNED_BYTE, &dummy_data);

			is_ok &= ErrorCheckAndLog("glClearNamedBufferSubData", GL_INVALID_VALUE,
									  "if offset is not multiples of the number of basic machine units (GLubyte)"
									  "per-element for the internal format (GL_RGBA) specified by internal format.");
		}

		/* Test incorrect range alignment error behavior. */
		{
			m_pClearNamedBufferSubData(buffer, GL_RGBA8, 0, sizeof(dummy_data) - sizeof(dummy_data[0]), GL_RGBA,
									   GL_UNSIGNED_BYTE, &dummy_data);

			is_ok &= ErrorCheckAndLog("glClearNamedBufferSubData", GL_INVALID_VALUE,
									  "if range is not multiples of the number of basic machine units (GLubyte)"
									  "per-element for the internal format (GL_RGBA) specified by internal format.");
		}

		/* Test negative offset error behavior. */
		{
			/* Test. */
			m_pClearNamedBufferSubData(buffer, GL_R8, -1, sizeof(dummy_data), GL_RGBA, GL_UNSIGNED_BYTE, &dummy_data);

			is_ok &= ErrorCheckAndLog("glClearNamedBufferSubData", GL_INVALID_VALUE, " if offset or size is negative.");
		}

		/* Test negative size error behavior. */
		{
			/* Test. */
			m_pClearNamedBufferSubData(buffer, GL_R8, 0, -((glw::GLsizei)sizeof(dummy_data)), GL_RGBA, GL_UNSIGNED_BYTE,
									   &dummy_data);

			is_ok &= ErrorCheckAndLog("glClearNamedBufferSubData", GL_INVALID_VALUE, " if offset or size is negative.");
		}

		/* Test size overflow error behavior. */
		{
			/* Test. */
			m_pClearNamedBufferSubData(buffer, GL_R8, 0, 2 * sizeof(dummy_data), GL_RGBA, GL_UNSIGNED_BYTE,
									   &dummy_data);

			is_ok &= ErrorCheckAndLog(
				"glClearNamedBufferSubData", GL_INVALID_VALUE,
				" if offset+size is greater than the value of BUFFER_SIZE for the specified buffer object.");
		}

		/* Test of mapped buffer clear error behavior verification (glMapNamedBuffer version). */
		{
			(void)(glw::GLbyte*) m_pMapNamedBuffer(buffer, GL_READ_ONLY);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBuffer failed.");

			m_pClearNamedBufferSubData(buffer, GL_R8, 0, sizeof(dummy_data), GL_RGBA, GL_UNSIGNED_BYTE, &dummy_data);

			is_ok &= ErrorCheckAndLog("glClearNamedBufferSubData", GL_INVALID_OPERATION,
									  " if any part of the specified range of the buffer"
									  " object is mapped with MapBuffer, unless it was mapped with "
									  "the MAP_PERSISTENT_BIT bit set in the MapBufferRange access flags.");

			m_pUnmapNamedBuffer(buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");
		}

		/* Test of mapped buffer clear error behavior verification (glMapNamedBufferRange version). */
		{
			(void)(glw::GLbyte*) m_pMapNamedBufferRange(buffer, 0, sizeof(dummy_data), GL_MAP_READ_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBuffer failed.");

			m_pClearNamedBufferSubData(buffer, GL_R8, 0, sizeof(dummy_data), GL_RGBA, GL_UNSIGNED_BYTE, &dummy_data);

			is_ok &= ErrorCheckAndLog("glClearNamedBufferSubData", GL_INVALID_OPERATION,
									  " if any part of the specified range of the buffer"
									  " object is mapped with MapBufferRange, unless it was mapped with "
									  "the MAP_PERSISTENT_BIT bit set in the MapBufferRange access flags.");

			m_pUnmapNamedBuffer(buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");
		}

		/* Test of persistently mapped buffer clear error with behavior verification (glMapNamedBufferRange version). */
		{
			(void)(glw::GLbyte*)
				m_pMapNamedBufferRange(buffer, 0, sizeof(dummy_data), GL_MAP_READ_BIT | GL_MAP_PERSISTENT_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBuffer failed.");

			m_pClearNamedBufferSubData(buffer, GL_R8, 0, sizeof(dummy_data), GL_RGBA, GL_UNSIGNED_BYTE, &dummy_data);

			is_ok &= ErrorCheckAndLog("glClearNamedBufferSubData", GL_NO_ERROR,
									  " if any part of the specified range of the buffer"
									  " object is mapped with MapBuffer with the MAP_PERSISTENT_BIT"
									  " bit set in the MapBufferRange access flags.");

			m_pUnmapNamedBuffer(buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");
		}

		/* Test invalid format error behavior. */
		{
			/* Prepare for invalid format error behavior verification. */
			static const glw::GLenum valid_formats[] = { GL_RED,		   GL_RG,
														 GL_RGB,		   GL_BGR,
														 GL_RGBA,		   GL_BGRA,
														 GL_RED_INTEGER,   GL_RG_INTEGER,
														 GL_RGB_INTEGER,   GL_BGR_INTEGER,
														 GL_RGBA_INTEGER,  GL_BGRA_INTEGER,
														 GL_STENCIL_INDEX, GL_DEPTH_COMPONENT,
														 GL_DEPTH_STENCIL };
			static const glw::GLenum valid_formats_last = sizeof(valid_formats) / sizeof(valid_formats[0]) - 1;

			glw::GLenum invalid_format = 0;

			while (&valid_formats[valid_formats_last] !=
				   std::find(&valid_formats[0], &valid_formats[valid_formats_last], (++invalid_format)))
				;

			/* Test. */
			m_pClearNamedBufferSubData(buffer, GL_R8, 0, sizeof(dummy_data), invalid_format, GL_UNSIGNED_BYTE,
									   &dummy_data);

			is_ok &= ErrorCheckAndLog(
				"glClearNamedBufferSubData", GL_INVALID_ENUM,
				" if format is not a valid format "
				"(one of GL_RED, GL_RG, GL_RGB, GL_BGR, GL_RGBA, GL_BGRA, "
				"GL_RED_INTEGER, GL_RG_INTEGER, GL_RGB_INTEGER, GL_BGR_INTEGER, GL_RGBA_INTEGER, GL_BGRA_INTEGER, "
				"GL_STENCIL_INDEX, GL_DEPTH_COMPONENT, GL_DEPTH_STENCIL).");
		}

		/* Test invalid type error behavior. */
		{
			/* Prepare for invalid type error behavior verification. */
			static const glw::GLenum valid_types[] = { GL_RED,			 GL_RG,
													   GL_RGB,			 GL_BGR,
													   GL_RGBA,			 GL_BGRA,
													   GL_RED_INTEGER,   GL_RG_INTEGER,
													   GL_RGB_INTEGER,   GL_BGR_INTEGER,
													   GL_RGBA_INTEGER,  GL_BGRA_INTEGER,
													   GL_STENCIL_INDEX, GL_DEPTH_COMPONENT,
													   GL_DEPTH_STENCIL, GL_NONE };
			static const glw::GLenum valid_types_last = sizeof(valid_types) / sizeof(valid_types[0]) - 1;

			glw::GLenum invalid_type = 0;

			while (&valid_types[valid_types_last] !=
				   std::find(&valid_types[0], &valid_types[valid_types_last], (++invalid_type)))
				;

			/* Test. */
			m_pClearNamedBufferSubData(buffer, GL_R8, 0, sizeof(dummy_data), GL_RGBA, invalid_type, &dummy_data);

			is_ok &= ErrorCheckAndLog(
				"glClearNamedBufferSubData", GL_INVALID_ENUM,
				" if format is not a valid type "
				"(one of GL_UNSIGNED_BYTE, GL_BYTE, GL_UNSIGNED_SHORT, "
				"GL_SHORT, GL_UNSIGNED_INT, GL_INT, GL_FLOAT, GL_UNSIGNED_BYTE_3_3_2, "
				"GL_UNSIGNED_BYTE_2_3_3_REV, GL_UNSIGNED_SHORT_5_6_5, "
				"GL_UNSIGNED_SHORT_5_6_5_REV, GL_UNSIGNED_SHORT_4_4_4_4, GL_UNSIGNED_SHORT_4_4_4_4_REV, "
				"GL_UNSIGNED_SHORT_5_5_5_1, GL_UNSIGNED_SHORT_1_5_5_5_REV, GL_UNSIGNED_INT_8_8_8_8, "
				"GL_UNSIGNED_INT_8_8_8_8_REV, GL_UNSIGNED_INT_10_10_10_2, and GL_UNSIGNED_INT_2_10_10_10_REV).");
		}
	}
	catch (...)
	{
		is_ok		   = false;
		internal_error = true;
	}

	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);

		buffer = 0;
	}

	if (internal_error)
	{
		throw 0;
	}

	return is_ok;
}